

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O2

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprDeclToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guard,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult)

{
  Expr *pEVar1;
  bool bVar2;
  long lVar3;
  __uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> expr_00;
  Parser *this_00;
  bool ismutable_1;
  bool ismutable;
  byte bStack_51;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr_1;
  undefined1 local_40 [16];
  
  bVar2 = isBiOpExpr((guard->_M_t).
                     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,TOK_OP_DCL);
  if (!bVar2) {
    bVar2 = isUnOpExpr((guard->_M_t).
                       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,TOK_OP_MUT);
    if (bVar2) {
      unopexpr_1._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>)
           (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      unopexpr._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>)
           ((Expr *)((long)unopexpr_1._M_t.
                           super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                           .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 0x38))
           ->parent;
      ((Expr *)((long)unopexpr_1._M_t.
                      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                      .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 0x38))->
      parent = (Expr *)0x0;
      _ismutable = CONCAT11(bStack_51,1);
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                (&unopexpr_1);
    }
    else {
      unopexpr._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>)
           (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      _ismutable = (ushort)bStack_51 << 8;
    }
    unopexpr_1._M_t.
    super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>)
         (__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)0x0;
    std::
    make_unique<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,decltype(nullptr),bool&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              (&this->lexer,(bool *)&unopexpr_1,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&ismutable,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&unopexpr,
               guardResult);
    if ((__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)
        unopexpr._M_t.
        super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
        super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)0x0) {
      return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
              )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
                )this;
    }
    lVar3 = *(long *)unopexpr._M_t.
                     super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                     .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl;
    expr_00._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         (tuple<pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>)
         (tuple<pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>)unopexpr;
    goto LAB_001112a9;
  }
  pEVar1 = (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_00128998) {
LAB_0011131d:
    __cxa_bad_cast();
  }
  bVar2 = isUnOpExpr((Expr *)pEVar1[1].lexer,TOK_OP_BAND);
  if (bVar2) {
    unopexpr._M_t.super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>)
         pEVar1[1].lexer;
    pEVar1[1].lexer = (Lexer *)0x0;
    ismutable_1 = true;
    expr_00._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         *(tuple<pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_> *)
          ((long)unopexpr._M_t.
                 super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                 .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 0x40);
    *(size_type *)
     ((long)unopexpr._M_t.
            super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
            super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 0x40) = 0;
    std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
              (&unopexpr);
  }
  else {
    expr_00._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         (tuple<pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>)pEVar1[1].lexer;
    pEVar1[1].lexer = (Lexer *)0x0;
    ismutable_1 = false;
  }
  bVar2 = isTokenExpr((Expr *)expr_00._M_t.
                              super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                              .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl,TOK_ID
                     );
  if (bVar2) {
    bVar2 = isUnOpExpr(*(Expr **)&pEVar1[1].type,TOK_OP_BAND);
    if (bVar2) {
      _ismutable = 2;
      unopexpr_1._M_t.
      super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
      super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._0_4_ = 7;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&unopexpr,(SyntaxErrorCode *)&ismutable,(Position *)&unopexpr_1);
      this_00 = (Parser *)local_40;
      goto LAB_0011127c;
    }
    lVar3 = __dynamic_cast(expr_00._M_t.
                           super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                           .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl,
                           &Expr::typeinfo,&TokenExpr::typeinfo,0);
    if (lVar3 == 0) goto LAB_0011131d;
    unopexpr._M_t.super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true> *)
          &((__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
           (lVar3 + 0x38))->_M_t;
    unopexpr_1._M_t.
    super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true> *)
          &pEVar1[1].type;
    *(undefined8 *)&pEVar1[1].type = 0;
    std::
    make_unique<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,pfederc::Token_const*,bool&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((Token **)this,(bool *)&unopexpr,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&ismutable_1,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&unopexpr_1,
               guardResult);
    if ((__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)
        unopexpr_1._M_t.
        super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
        super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)0x0) {
      (**(code **)(*(long *)unopexpr_1._M_t.
                            super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                            .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl + 8))();
    }
  }
  else {
    _ismutable = 2;
    unopexpr_1._M_t.
    super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
    super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl._0_4_ = 6;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&unopexpr,(SyntaxErrorCode *)&ismutable,(Position *)&unopexpr_1);
    this_00 = (Parser *)(local_40 + 8);
LAB_0011127c:
    generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)expr);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&unopexpr);
    this->lexer = (Lexer *)0x0;
  }
  lVar3 = *(long *)expr_00._M_t.
                   super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>
                   .super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl;
LAB_001112a9:
  (**(code **)(lVar3 + 8))
            (expr_00._M_t.
             super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
             super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl);
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprDeclToFunctionParam(
    std::unique_ptr<Expr> &&expr, std::unique_ptr<Expr> &&guard,
    std::unique_ptr<Expr> &&guardResult) noexcept {
  // '&'id ':' expr | id ':' expr | '&' expr | expr
  if (isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    // '&'id ':' expr | id ':' expr
    BiOpExpr &biopdcl = dynamic_cast<BiOpExpr&>(*expr);

    std::unique_ptr<Expr> idexpr;
    bool ismutable;
    if (isUnOpExpr(biopdcl.getLeft(), TokenType::TOK_OP_BAND)) {
      std::unique_ptr<UnOpExpr> unopexpr =
          std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(biopdcl.getLeftPtr().release()));
      ismutable = true;
      idexpr = unopexpr->getExpressionPtr();
    } else {
      idexpr = biopdcl.getLeftPtr();
      ismutable = false;
    }

    if (!isTokenExpr(*idexpr, TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, idexpr->getPosition()));
      return nullptr;
    }

    if (isUnOpExpr(biopdcl.getRight(), TokenType::TOK_OP_BAND)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL, biopdcl.getRight().getPosition()));
      return nullptr;
    }

    return std::make_unique<FuncParameter>(
      &dynamic_cast<const TokenExpr&>(*idexpr).getToken(),
      ismutable,
      biopdcl.getRightPtr(),
      std::move(guard), std::move(guardResult));
  }
  // '&' expr | expr
  std::unique_ptr<Expr> typeexpr;
  bool ismutable;
  if (isUnOpExpr(*expr, TokenType::TOK_OP_MUT)) {
    std::unique_ptr<UnOpExpr> unopexpr =
      std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(expr.release()));
    typeexpr = unopexpr->getExpressionPtr();
    ismutable = true;
  } else {
    typeexpr = std::move(expr);
    ismutable = false;
  }

  return std::make_unique<FuncParameter>(
    nullptr, ismutable, std::move(typeexpr),
    std::move(guard), std::move(guardResult));
}